

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffgiet(fitsfile *fptr,int *imgtype,int *status)

{
  int iVar1;
  uint uVar2;
  char *keyname;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int tstatus;
  double bscale;
  double bzero;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar1 = ffrdef(fptr,status), 0 < iVar1))
    goto LAB_0017dfd5;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  ffmaky(fptr,2,status);
  if (fptr->Fptr->hdutype == 0) {
    keyname = "BITPIX";
  }
  else {
    if (fptr->Fptr->compressimg == 0) {
      *status = 0xe9;
      return 0xe9;
    }
    keyname = "ZBITPIX";
  }
  ffgky(fptr,0x1f,keyname,imgtype,(char *)0x0,status);
  tstatus = 0;
  ffgky(fptr,0x52,"BSCALE",&bscale,(char *)0x0,&tstatus);
  if (tstatus != 0) {
    bscale = 1.0;
  }
  tstatus = 0;
  ffgky(fptr,0x52,"BZERO",&bzero,(char *)0x0,&tstatus);
  if (tstatus != 0) {
    bzero = 0.0;
  }
  if ((((bscale == 1.0) && (!NAN(bscale))) && (bzero == 0.0)) && (!NAN(bzero))) goto LAB_0017dfd5;
  iVar1 = *imgtype;
  if (iVar1 == 8) {
    dVar3 = 255.0;
    dVar4 = 0.0;
  }
  else if (iVar1 == 0x20) {
    dVar3 = 2147483647.0;
    dVar4 = -2147483648.0;
  }
  else {
    if (iVar1 != 0x10) goto LAB_0017dfd5;
    dVar3 = 32767.0;
    dVar4 = -32768.0;
  }
  dVar5 = dVar4 * bscale + bzero;
  dVar4 = dVar5;
  if (bscale < 0.0) {
    dVar4 = bscale * dVar5 + bzero;
  }
  if ((bzero != 2147483648.0) || (NAN(bzero))) {
    dVar6 = (double)(-(ulong)(bzero < 2147483648.0) & (ulong)(double)(long)bzero);
    if ((dVar6 == bzero) && (!NAN(dVar6) && !NAN(bzero))) {
      if ((bscale == (double)(long)bscale) && (!NAN(bscale) && !NAN((double)(long)bscale)))
      goto LAB_0017df35;
    }
    uVar2 = (uint)((iVar1 - 8U & 0xfffffff7) == 0) << 5 | 0xffffffc0;
  }
  else {
LAB_0017df35:
    dVar3 = (double)(~-(ulong)(bscale < 0.0) & (ulong)(dVar3 * bscale + bzero) |
                    (ulong)dVar5 & -(ulong)(bscale < 0.0));
    if ((((dVar4 != -128.0) || (NAN(dVar4))) || (dVar3 != 127.0)) || (NAN(dVar3))) {
      if ((dVar4 < -32768.0) || (32767.0 < dVar3)) {
        if ((dVar4 < 0.0) || (65535.0 < dVar3)) {
          if ((dVar4 < -2147483648.0) || (2147483647.0 < dVar3)) {
            uVar2 = 0xffffffc0;
            if (0.0 <= dVar4 && dVar3 < 4294967296.0) {
              uVar2 = 0x28;
            }
          }
          else {
            uVar2 = 0x20;
          }
        }
        else {
          uVar2 = 0x14;
        }
      }
      else {
        uVar2 = 0x10;
      }
    }
    else {
      uVar2 = 10;
    }
  }
  *imgtype = uVar2;
LAB_0017dfd5:
  return *status;
}

Assistant:

int ffgiet( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  *imgtype,   /* O - image data type                         */
            int  *status)    /* IO - error status                           */
/*
  Get the effective datatype of the image (= BITPIX keyword for normal image,
  or ZBITPIX for a compressed image)
*/
{
    int tstatus;
    long lngscale, lngzero = 0;
    double bscale, bzero, min_val, max_val;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    /* reset to beginning of header */
    ffmaky(fptr, 2, status);  /* simply move to beginning of header */

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        ffgky(fptr, TINT, "BITPIX", imgtype, NULL, status);
    }
    else if ((fptr->Fptr)->compressimg)
    {
        /* this is a binary table containing a compressed image */
        ffgky(fptr, TINT, "ZBITPIX", imgtype, NULL, status);
    }
    else
    {
        *status = NOT_IMAGE;
        return(*status);

    }

    /* check if the BSCALE and BZERO keywords are defined, which might
       change the effective datatype of the image  */
    tstatus = 0;
    ffgky(fptr, TDOUBLE, "BSCALE", &bscale, NULL, &tstatus);
    if (tstatus)
           bscale = 1.0;

    tstatus = 0;
    ffgky(fptr, TDOUBLE, "BZERO", &bzero, NULL, &tstatus);
    if (tstatus)
           bzero = 0.0;

    if (bscale == 1.0 && bzero == 0.0)  /* no scaling */
        return(*status);

    switch (*imgtype)
    {
      case BYTE_IMG:   /* 8-bit image */
        min_val = 0.;
        max_val = 255.0;
        break;

      case SHORT_IMG:
        min_val = -32768.0;
        max_val =  32767.0;
        break;
        
      case LONG_IMG:

        min_val = -2147483648.0;
        max_val =  2147483647.0;
        break;
        
      default:  /* don't have to deal with other data types */
        return(*status);
    }

    if (bscale >= 0.) {
        min_val = bzero + bscale * min_val;
        max_val = bzero + bscale * max_val;
    } else {
        max_val = bzero + bscale * min_val;
        min_val = bzero + bscale * max_val;
    }
    if (bzero < 2147483648.)  /* don't exceed range of 32-bit integer */
       lngzero = (long) bzero;
    lngscale = (long) bscale;

    if ((bzero != 2147483648.) && /* special value that exceeds integer range */
       (lngzero != bzero || lngscale != bscale)) { /* not integers? */
       /* floating point scaled values; just decide on required precision */
       if (*imgtype == BYTE_IMG || *imgtype == SHORT_IMG)
          *imgtype = FLOAT_IMG;
       else
         *imgtype = DOUBLE_IMG;

    /*
       In all the remaining cases, BSCALE and BZERO are integers,
       and not equal to 1 and 0, respectively.  
    */

    } else if ((min_val == -128.) && (max_val == 127.)) {
       *imgtype = SBYTE_IMG;

    } else if ((min_val >= -32768.0) && (max_val <= 32767.0)) {
       *imgtype = SHORT_IMG;

    } else if ((min_val >= 0.0) && (max_val <= 65535.0)) {
       *imgtype = USHORT_IMG;

    } else if ((min_val >= -2147483648.0) && (max_val <= 2147483647.0)) {
       *imgtype = LONG_IMG;

    } else if ((min_val >= 0.0) && (max_val < 4294967296.0)) {
       *imgtype = ULONG_IMG;

    } else {  /* exceeds the range of a 32-bit integer */
       *imgtype = DOUBLE_IMG;
    }   

    return(*status);
}